

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCIIHexDecoder.cc
# Opt level: O0

ssize_t __thiscall
Pl_ASCIIHexDecoder::write(Pl_ASCIIHexDecoder *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  int iVar2;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char local_2b [3];
  char t [2];
  Pl_ASCIIHexDecoder *pPStack_28;
  char ch;
  size_t i;
  size_t len_local;
  uchar *buf_local;
  Pl_ASCIIHexDecoder *this_local;
  
  pPStack_28 = this;
  if ((this->eod & 1U) == 0) {
    for (pPStack_28 = (Pl_ASCIIHexDecoder *)0x0; pPStack_28 < __buf;
        pPStack_28 = (Pl_ASCIIHexDecoder *)((long)&(pPStack_28->super_Pipeline)._vptr_Pipeline + 1))
    {
      iVar2 = toupper((uint)(byte)pPStack_28->inbuf[CONCAT44(in_register_00000034,__fd) + -0x30]);
      local_2b[0] = (char)iVar2;
      iVar2 = (int)local_2b[0];
      local_2b[2] = local_2b[0];
      if ((iVar2 - 9U < 5) || (iVar2 == 0x20)) {
        QTC::TC("libtests","Pl_ASCIIHexDecoder ignore space",0);
      }
      else if (iVar2 == 0x3e) {
        this->eod = true;
        flush(this);
      }
      else {
        if (((local_2b[0] < '0') || ('9' < local_2b[0])) &&
           ((local_2b[0] < 'A' || ('F' < local_2b[0])))) {
          local_2b[1] = 0;
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          s_abi_cxx11_(&local_70,"character out of range during base Hex decode: ",0x2f);
          std::operator+(&local_50,&local_70,local_2b);
          std::runtime_error::runtime_error(this_00,(string *)&local_50);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sVar1 = this->pos;
        this->pos = sVar1 + 1;
        this->inbuf[sVar1] = local_2b[0];
        if (this->pos == 2) {
          flush(this);
        }
      }
      if ((this->eod & 1U) != 0) {
        return (ssize_t)this;
      }
    }
  }
  return (ssize_t)pPStack_28;
}

Assistant:

void
Pl_ASCIIHexDecoder::write(unsigned char const* buf, size_t len)
{
    if (this->eod) {
        return;
    }
    for (size_t i = 0; i < len; ++i) {
        char ch = static_cast<char>(toupper(buf[i]));
        switch (ch) {
        case ' ':
        case '\f':
        case '\v':
        case '\t':
        case '\r':
        case '\n':
            QTC::TC("libtests", "Pl_ASCIIHexDecoder ignore space");
            // ignore whitespace
            break;

        case '>':
            this->eod = true;
            flush();
            break;

        default:
            if (((ch >= '0') && (ch <= '9')) || ((ch >= 'A') && (ch <= 'F'))) {
                this->inbuf[this->pos++] = ch;
                if (this->pos == 2) {
                    flush();
                }
            } else {
                char t[2];
                t[0] = ch;
                t[1] = 0;
                throw std::runtime_error("character out of range during base Hex decode: "s + t);
            }
            break;
        }
        if (this->eod) {
            break;
        }
    }
}